

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::AssertionExpr_const*>::
emplace_back<slang::ast::AssertionExpr_const*>
          (SmallVectorBase<slang::ast::AssertionExpr_const*> *this,AssertionExpr **args)

{
  long lVar1;
  reference ppAVar2;
  pointer ppAVar3;
  
  lVar1 = *(long *)(this + 8);
  ppAVar3 = (pointer)(lVar1 * 8 + *(long *)this);
  if (lVar1 == *(long *)(this + 0x10)) {
    ppAVar3 = emplaceRealloc<slang::ast::AssertionExpr_const*>(this,ppAVar3,args);
    return ppAVar3;
  }
  *ppAVar3 = *args;
  *(long *)(this + 8) = lVar1 + 1;
  ppAVar2 = SmallVectorBase<const_slang::ast::AssertionExpr_*>::back
                      ((SmallVectorBase<const_slang::ast::AssertionExpr_*> *)this);
  return ppAVar2;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }